

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

void __thiscall
capnp::DynamicList::Builder::adopt(Builder *this,uint index,Orphan<capnp::DynamicValue> *orphan)

{
  StructBuilder other;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Which WVar3;
  StructSize size;
  StructSchema SVar4;
  InterfaceSchema other_00;
  Schema in_stack_ffffffffffffff48;
  bool _kjCondition_2;
  bool _kjCondition;
  undefined1 auStack_a7 [15];
  Fault f;
  StructBuilder local_50;
  
  WVar3 = LIST;
  if ((this->schema).elementType.listDepth == '\0') {
    WVar3 = (this->schema).elementType.baseType;
  }
  switch(WVar3) {
  case VOID:
  case BOOL:
  case INT8:
  case INT16:
  case INT32:
  case INT64:
  case UINT8:
  case UINT16:
  case UINT32:
  case UINT64:
  case FLOAT32:
  case FLOAT64:
  case ENUM:
    Orphan<capnp::DynamicValue>::getReader((Reader *)&f,orphan);
    set(this,index,(Reader *)&f);
    DynamicValue::Reader::~Reader((Reader *)&f);
    return;
  case TEXT:
    f.exception._4_4_ = 6;
    f.exception._0_4_ = orphan->type;
    if (orphan->type != TEXT) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::DynamicValue::Type,capnp::DynamicValue::Type>&,char_const(&)[21]>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x52b,FAILED,"orphan.getType() == DynamicValue::TEXT",
                 "_kjCondition,\"Value type mismatch.\"",
                 (DebugComparison<capnp::DynamicValue::Type,_capnp::DynamicValue::Type> *)&f,
                 (char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    }
    break;
  case DATA:
    f.exception._4_4_ = 7;
    f.exception._0_4_ = orphan->type;
    if (orphan->type != DATA) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::DynamicValue::Type,capnp::DynamicValue::Type>&,char_const(&)[21]>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x530,FAILED,"orphan.getType() == DynamicValue::DATA",
                 "_kjCondition,\"Value type mismatch.\"",
                 (DebugComparison<capnp::DynamicValue::Type,_capnp::DynamicValue::Type> *)&f,
                 (char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    }
    break;
  case LIST:
    __kjCondition = (Type)Type::asList((Type *)this);
    if (orphan->type == LIST) {
      _kjCondition_2 = Type::operator==((Type *)&(orphan->field_1).enumValue,(Type *)&_kjCondition);
      if (_kjCondition_2) break;
    }
    else {
      _kjCondition_2 = false;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[21]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x537,FAILED,
               "orphan.getType() == DynamicValue::LIST && orphan.listSchema == elementType",
               "_kjCondition,\"Value type mismatch.\"",&_kjCondition_2,
               (char (*) [21])"Value type mismatch.");
    kj::_::Debug::Fault::fatal(&f);
  case STRUCT:
    SVar4 = Type::asStruct((Type *)this);
    if (orphan->type == STRUCT) {
      _kjCondition = (RawBrandedSchema *)(orphan->field_1).intValue == SVar4.super_Schema.raw;
      if (_kjCondition) {
        capnp::_::ListBuilder::getStructElement((StructBuilder *)&f,&this->builder,index);
        size = anon_unknown_71::structSizeFromSchema((StructSchema)in_stack_ffffffffffffff48.raw);
        capnp::_::OrphanBuilder::asStruct(&local_50,&orphan->builder,size);
        other.capTable = local_50.capTable;
        other.segment = local_50.segment;
        other.data = local_50.data;
        other.pointers = local_50.pointers;
        other.dataSize = local_50.dataSize;
        other.pointerCount = local_50.pointerCount;
        other._38_2_ = local_50._38_2_;
        capnp::_::StructBuilder::transferContentFrom((StructBuilder *)&f,other);
        return;
      }
    }
    else {
      auVar1[0xf] = 0;
      auVar1._0_15_ = auStack_a7;
      __kjCondition = (Type)(auVar1 << 8);
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[21]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x53f,FAILED,
               "orphan.getType() == DynamicValue::STRUCT && orphan.structSchema == elementType",
               "_kjCondition,\"Value type mismatch.\"",&_kjCondition,
               (char (*) [21])"Value type mismatch.");
    kj::_::Debug::Fault::fatal(&f);
  case INTERFACE:
    other_00 = Type::asInterface((Type *)this);
    if (orphan->type == CAPABILITY) {
      _kjCondition = InterfaceSchema::extends(&(orphan->field_1).interfaceSchema,other_00);
      if (_kjCondition) break;
    }
    else {
      auVar2[0xf] = 0;
      auVar2._0_15_ = auStack_a7;
      __kjCondition = (Type)(auVar2 << 8);
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[21]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x54c,FAILED,
               "orphan.getType() == DynamicValue::CAPABILITY && orphan.interfaceSchema.extends(elementType)"
               ,"_kjCondition,\"Value type mismatch.\"",&_kjCondition,
               (char (*) [21])"Value type mismatch.");
    kj::_::Debug::Fault::fatal(&f);
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x546,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
               (char (*) [32])"List(AnyPointer) not supported.");
    kj::_::Debug::Fault::fatal(&f);
  default:
    kj::_::unreachable();
  }
  f.exception = (Exception *)(this->builder).segment;
  capnp::_::PointerBuilder::adopt((PointerBuilder *)&f,&orphan->builder);
  return;
}

Assistant:

void DynamicList::Builder::adopt(uint index, Orphan<DynamicValue>&& orphan) {
  switch (schema.whichElementType()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::ENUM:
      set(index, orphan.getReader());
      return;

    case schema::Type::TEXT:
      KJ_REQUIRE(orphan.getType() == DynamicValue::TEXT, "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;

    case schema::Type::DATA:
      KJ_REQUIRE(orphan.getType() == DynamicValue::DATA, "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;

    case schema::Type::LIST: {
      ListSchema elementType = schema.getListElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::LIST && orphan.listSchema == elementType,
                 "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;
    }

    case schema::Type::STRUCT: {
      auto elementType = schema.getStructElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::STRUCT && orphan.structSchema == elementType,
                 "Value type mismatch.");
      builder.getStructElement(bounded(index) * ELEMENTS).transferContentFrom(
          orphan.builder.asStruct(structSizeFromSchema(elementType)));
      return;
    }

    case schema::Type::ANY_POINTER:
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");

    case schema::Type::INTERFACE: {
      auto elementType = schema.getInterfaceElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::CAPABILITY &&
                 orphan.interfaceSchema.extends(elementType),
                 "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;
    }
  }

  KJ_UNREACHABLE;
}